

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O3

int Min_SopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  Min_Cube_t *pMVar1;
  bool bVar2;
  Min_Cube_t **ppMVar3;
  uint uVar4;
  Min_Cube_t **ppMVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  Min_Cube_t *pMVar9;
  ulong uVar10;
  ulong uVar11;
  Min_Cube_t *pMVar12;
  Min_Cube_t *pMVar13;
  Min_Cube_t *pEntry;
  
  ppMVar5 = p->ppStore;
  uVar4 = *(uint *)&pCube->field_0x8;
  uVar6 = (ulong)(uVar4 >> 0x16);
  pMVar13 = ppMVar5[uVar6];
  if (pMVar13 != (Min_Cube_t *)0x0) {
    uVar8 = uVar4 >> 10 & 0xfff;
    pMVar9 = pMVar13;
    if (uVar8 == 0) {
LAB_0045355c:
      Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pCube);
      return 0;
    }
    do {
      uVar10 = 0;
      while (pCube->uData[uVar10] == pMVar9->uData[uVar10]) {
        uVar10 = uVar10 + 1;
        if (uVar8 == uVar10) goto LAB_0045355c;
      }
      ppMVar3 = &pMVar9->pNext;
      pMVar9 = *ppMVar3;
    } while (*ppMVar3 != (Min_Cube_t *)0x0);
  }
  if (0x3fffff < uVar4) {
    uVar10 = 0;
    do {
      pMVar9 = ppMVar5[uVar10];
      if (pMVar9 != (Min_Cube_t *)0x0) {
        do {
          if (pMVar9 != p->pBubble) {
            uVar8 = *(uint *)&pMVar9->field_0x8 >> 10 & 0xfff;
            if (uVar8 == 0) goto LAB_0045355c;
            uVar11 = 0;
            while ((pCube->uData[uVar11] & ~pMVar9->uData[uVar11]) == 0) {
              uVar11 = uVar11 + 1;
              if (uVar8 == uVar11) goto LAB_0045355c;
            }
          }
          pMVar9 = pMVar9->pNext;
        } while (pMVar9 != (Min_Cube_t *)0x0);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar6);
  }
  if (pMVar13 != (Min_Cube_t *)0x0) {
    pMVar9 = (Min_Cube_t *)(ppMVar5 + uVar6);
    uVar8 = uVar4 >> 10 & 0xfff;
    pMVar1 = pMVar13;
    pMVar12 = pMVar9;
    do {
      pEntry = pMVar1;
      if (uVar8 == 0) {
LAB_0045357f:
        putchar(10);
        Min_CubeWrite(_stdout,pCube);
        Min_CubeWrite(_stdout,pMVar13);
        puts("Error: Min_CubesDistOne() looks at two equal cubes!");
        pMVar12 = pMVar9;
        pEntry = pMVar13;
LAB_004535b4:
        pMVar12->pNext = pEntry->pNext;
        uVar4 = *(uint *)&pCube->field_0x8;
        uVar8 = uVar4 >> 10 & 0xfff;
        if (uVar8 != 0) {
          uVar6 = 0;
          do {
            pCube->uData[uVar6] = pCube->uData[uVar6] | pEntry->uData[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        *(uint *)&pCube->field_0x8 = uVar4 - 0x400000;
        Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pEntry);
        p->nCubes = p->nCubes + -1;
        return 1;
      }
      bVar2 = true;
      uVar10 = 0;
      while( true ) {
        while( true ) {
          uVar11 = uVar10 + 1;
          if (pCube->uData[uVar10] != pEntry->uData[uVar10]) break;
          uVar10 = uVar11;
          if (uVar11 == uVar8) {
            pMVar9 = pMVar12;
            pMVar13 = pEntry;
            if (!bVar2) goto LAB_004535b4;
            goto LAB_0045357f;
          }
        }
        if ((!bVar2) ||
           (uVar7 = pEntry->uData[uVar10] ^ pCube->uData[uVar10],
           uVar7 = (uVar7 >> 1 | uVar7) & 0x55555555, (uVar7 & uVar7 - 1) != 0)) break;
        bVar2 = false;
        uVar10 = uVar11;
        if (uVar11 == uVar8) goto LAB_004535b4;
      }
      pMVar1 = pEntry->pNext;
      pMVar12 = pEntry;
    } while (pEntry->pNext != (Min_Cube_t *)0x0);
  }
  if (uVar4 >> 0x16 < (uVar4 & 0x3ff)) {
    uVar6 = (ulong)(uVar4 >> 0x16);
    do {
      pMVar13 = p->ppStore[uVar6 + 1];
      if (pMVar13 != (Min_Cube_t *)0x0) {
        pMVar9 = (Min_Cube_t *)(p->ppStore + uVar6 + 1);
        do {
          pMVar1 = pMVar13->pNext;
          pMVar12 = pMVar13;
          if (pMVar13 != p->pBubble) {
            uVar4 = *(uint *)&pCube->field_0x8 >> 10 & 0xfff;
            if (uVar4 != 0) {
              uVar10 = 0;
              do {
                if ((pMVar13->uData[uVar10] & ~pCube->uData[uVar10]) != 0) goto LAB_004534d4;
                uVar10 = uVar10 + 1;
              } while (uVar4 != uVar10);
            }
            pMVar9->pNext = pMVar13->pNext;
            Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pMVar13);
            p->nCubes = p->nCubes + -1;
            pMVar12 = pMVar9;
          }
LAB_004534d4:
          pMVar13 = pMVar1;
          pMVar9 = pMVar12;
        } while (pMVar1 != (Min_Cube_t *)0x0);
        uVar4 = *(uint *)&pCube->field_0x8;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uVar4 & 0x3ff));
    ppMVar5 = p->ppStore;
    uVar6 = (ulong)(uVar4 >> 0x16);
  }
  pCube->pNext = ppMVar5[uVar6];
  ppMVar5[uVar6] = pCube;
  p->nCubes = p->nCubes + 1;
  return 0;
}

Assistant:

int Min_SopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, * pThis2, ** ppPrev;
    int i;
    // try to find the identical cube
    Min_CoverForEachCube( p->ppStore[pCube->nLits], pThis )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find a containing cube
    for ( i = 0; i < (int)pCube->nLits; i++ )
    Min_CoverForEachCube( p->ppStore[i], pThis )
    {
        if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find distance one in the same bin
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, NULL ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransformOr( pCube, pThis );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }

    // clean the other cubes using this one
    for ( i = pCube->nLits + 1; i <= (int)pCube->nVars; i++ )
    {
        ppPrev = &p->ppStore[i];
        Min_CoverForEachCubeSafe( p->ppStore[i], pThis, pThis2 )
        {
            if ( pThis != p->pBubble && Min_CubeIsContained( pCube, pThis ) )
            {
                *ppPrev = pThis->pNext;
                Min_CubeRecycle( p, pThis );
                p->nCubes--;
            }
            else
                ppPrev = &pThis->pNext;
        }
    }

    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}